

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggressive_dead_code_elim_pass.cpp
# Opt level: O0

bool __thiscall
spvtools::opt::AggressiveDCEPass::IsEntryPoint(AggressiveDCEPass *this,Function *func)

{
  bool bVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  Instruction *this_00;
  uint32_t entry_point_id;
  Instruction *entry_point;
  iterator __end2;
  iterator __begin2;
  IteratorRange<spvtools::opt::InstructionList::iterator> *__range2;
  Function *func_local;
  AggressiveDCEPass *this_local;
  
  Pass::get_module((Pass *)this);
  Module::entry_points((Module *)&__begin2);
  IteratorRange<spvtools::opt::InstructionList::iterator>::begin
            ((IteratorRange<spvtools::opt::InstructionList::iterator> *)&__end2);
  IteratorRange<spvtools::opt::InstructionList::iterator>::end
            ((IteratorRange<spvtools::opt::InstructionList::iterator> *)&entry_point);
  while( true ) {
    bVar1 = utils::operator!=(&__end2.super_iterator,
                              (iterator_template<spvtools::opt::Instruction> *)&entry_point);
    if (!bVar1) {
      return false;
    }
    this_00 = utils::IntrusiveList<spvtools::opt::Instruction>::
              iterator_template<spvtools::opt::Instruction>::operator*(&__end2.super_iterator);
    uVar2 = opt::Instruction::GetSingleWordInOperand(this_00,1);
    uVar3 = opt::Function::result_id(func);
    if (uVar2 == uVar3) break;
    InstructionList::iterator::operator++(&__end2);
  }
  return true;
}

Assistant:

bool AggressiveDCEPass::IsEntryPoint(Function* func) {
  for (const Instruction& entry_point : get_module()->entry_points()) {
    uint32_t entry_point_id =
        entry_point.GetSingleWordInOperand(kEntryPointFunctionIdInIdx);
    if (entry_point_id == func->result_id()) {
      return true;
    }
  }
  return false;
}